

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionUtils.h
# Opt level: O0

void __thiscall ExpressionUtils::~ExpressionUtils(ExpressionUtils *this)

{
  bool bVar1;
  reference ppEVar2;
  __normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>
  local_20;
  __normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>
  local_18;
  iterator it;
  ExpressionUtils *this_local;
  
  it._M_current = (Expression **)this;
  local_18._M_current =
       (Expression **)
       std::vector<Expression_*,_std::allocator<Expression_*>_>::begin(&this->deathMap);
  while( true ) {
    local_20._M_current =
         (Expression **)
         std::vector<Expression_*,_std::allocator<Expression_*>_>::end(&this->deathMap);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>
              ::operator*(&local_18);
    if (*ppEVar2 != (Expression *)0x0) {
      (*(*ppEVar2)->_vptr_Expression[4])();
    }
    __gnu_cxx::
    __normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>::
    operator++(&local_18,0);
  }
  std::vector<Expression_*,_std::allocator<Expression_*>_>::~vector(&this->deathMap);
  return;
}

Assistant:

~ExpressionUtils(){
        auto it = this->deathMap.begin();
        while (it != this->deathMap.end()){
            delete *it;
            it++;
        }
    }